

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf.cxx
# Opt level: O2

void __thiscall xray_re::xr_ogf::check_unhandled_chunks(xr_ogf *this,xr_reader *r)

{
  xr_reader *prev;
  uint32_t id;
  uint local_2c;
  
  prev = (xr_reader *)0x0;
  while( true ) {
    prev = xr_reader::open_chunk_next(r,&local_2c,prev);
    if (prev == (xr_reader *)0x0) break;
    if ((this->m_loaded >> (local_2c & 0x1f) & 1) == 0) {
      msg("unhandled chunk %u");
    }
  }
  return;
}

Assistant:

void xr_ogf::check_unhandled_chunks(xr_reader& r) const
{
	// FIXME: there is no need to "open" chunks
	uint32_t id;
	for (xr_reader* s = 0; (s = r.open_chunk_next(id, s)) != 0;) {
		if (!is_chunk_loaded(id))
			msg("unhandled chunk %u", id);
	}
}